

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx_functor::unary_op_asin>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  long *in_RDI;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 in_ZMM2 [64];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_asin op;
  Mat *m;
  __m256 final_approx;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 big_input_approx;
  __m256 is_big_input;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_three;
  __m256 magic_half_pi;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_one;
  __m256 magic_half_one;
  __m256 magic_negative_zero;
  __m128 final_approx_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 big_input_approx_1;
  __m128 is_big_input_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_three_1;
  __m128 magic_half_pi_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_one_1;
  __m128 magic_half_one_1;
  __m128 magic_negative_zero_1;
  undefined1 local_1830 [16];
  undefined1 local_1820 [32];
  int local_17fc;
  undefined8 local_17f8;
  undefined8 local_17f0;
  undefined8 local_17e8;
  undefined4 local_17e0;
  long local_17d8;
  undefined4 local_17d0;
  undefined4 local_17cc;
  undefined4 local_17c8;
  undefined4 local_17c4;
  undefined4 local_17c0;
  undefined8 local_17b8;
  undefined1 (*local_17b0) [32];
  int local_17a8;
  int local_17a4;
  int local_17a0;
  int local_179c;
  int local_1798;
  int local_1794;
  int local_1790;
  undefined1 local_1789 [9];
  long *local_1780;
  undefined1 local_1775;
  int local_1774;
  undefined8 *local_1768;
  undefined8 *local_1760;
  undefined8 *local_1750;
  undefined1 (*local_1748) [32];
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined1 (*local_1710) [32];
  undefined1 (*local_1708) [32];
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined1 (*local_16f0) [32];
  long local_16e8;
  undefined4 local_16dc;
  long local_16d8;
  undefined1 (*local_16d0) [32];
  undefined4 local_16c4;
  int local_16c0;
  int local_16bc;
  undefined8 *local_16b8;
  undefined4 local_16ac;
  long local_16a8;
  undefined8 *local_1698;
  undefined1 *local_1670;
  undefined1 *local_1668;
  undefined1 *local_1660;
  undefined1 *local_1658;
  undefined1 (*local_1650) [32];
  undefined1 *local_1648;
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  undefined1 local_1620 [32];
  float local_1600;
  float fStack_15fc;
  float fStack_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float fStack_15e8;
  float fStack_15e4;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  float fStack_1564;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  float local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  float local_1500;
  float fStack_14fc;
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10e0 [8];
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  undefined4 uStack_1084;
  float *local_1078;
  undefined1 *local_1070;
  float *local_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  float *local_1018;
  float *local_1010;
  float *local_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  undefined8 *local_fb8;
  float *local_fb0;
  float *local_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  undefined8 *local_f58;
  undefined8 *local_f50;
  float *local_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  float fStack_f04;
  undefined8 *local_ef8;
  float *local_ef0;
  float *local_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  undefined8 *local_e98;
  undefined8 *local_e90;
  float *local_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  undefined8 *local_e38;
  undefined1 *local_e30;
  undefined8 *local_e28;
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  undefined4 uStack_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined1 local_dc0 [8];
  float fStack_db8;
  float fStack_db4;
  float fStack_db0;
  float fStack_dac;
  float fStack_da8;
  undefined4 uStack_da4;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  float local_d80;
  float fStack_d7c;
  float fStack_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  float fStack_d68;
  float fStack_d64;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [32];
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined4 local_acc;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined4 local_aac;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined1 local_aa0 [16];
  undefined1 auStack_a90 [16];
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined1 local_a60 [16];
  undefined1 auStack_a50 [16];
  undefined4 local_a40;
  undefined4 local_a3c;
  undefined4 local_a38;
  undefined4 local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined1 local_a20 [16];
  undefined1 auStack_a10 [16];
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined1 local_9e0 [16];
  undefined1 auStack_9d0 [16];
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined1 local_9a0 [16];
  undefined1 auStack_990 [16];
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  undefined4 local_964;
  undefined1 local_960 [16];
  undefined1 auStack_950 [16];
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined4 local_924;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined4 local_900;
  undefined4 local_8fc;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined4 local_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7e4;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  undefined1 local_7d0 [16];
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float local_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float local_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float local_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  float local_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 *local_4f8;
  undefined1 *local_4f0;
  undefined8 *local_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined1 local_4b0 [16];
  float *local_498;
  undefined1 *local_490;
  float *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float *local_438;
  float *local_430;
  float *local_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  float local_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined8 *local_3d8;
  float *local_3d0;
  float *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 *local_378;
  undefined8 *local_370;
  float *local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 *local_318;
  float *local_310;
  float *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  float local_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  float *local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  float local_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_34;
  
  local_1790 = *(int *)((long)in_RDI + 0x2c);
  local_1794 = (int)in_RDI[6];
  local_1798 = *(int *)((long)in_RDI + 0x34);
  local_179c = (int)in_RDI[7];
  local_17a0 = (int)in_RDI[3];
  local_17a4 = local_1790 * local_1794 * local_1798 * local_17a0;
  local_1780 = in_RDI;
  for (local_17a8 = 0; local_17a8 < local_179c; local_17a8 = local_17a8 + 1) {
    local_1768 = &local_17f8;
    local_16bc = *(int *)((long)local_1780 + 0x2c);
    local_16c0 = (int)local_1780[6];
    local_16c4 = *(undefined4 *)((long)local_1780 + 0x34);
    local_16d0 = (undefined1 (*) [32])
                 (*local_1780 + local_1780[8] * (long)local_17a8 * local_1780[2]);
    local_16d8 = local_1780[2];
    local_16dc = (undefined4)local_1780[3];
    local_16e8 = local_1780[4];
    local_16b8 = &local_17f8;
    local_16a8 = (long)local_16bc * (long)local_16c0 * local_16d8;
    local_1760 = &local_17f8;
    local_1750 = &local_17f8;
    local_16ac = 0x10;
    local_1774 = local_17a8;
    local_1775 = 1;
    local_17f8 = 0;
    local_17e8 = 0;
    local_17e0 = 0;
    local_17d0 = 0;
    local_17cc = 0;
    local_17c8 = 0;
    local_17c4 = 0;
    local_17c0 = 0;
    local_17b8 = 0;
    local_17f0 = 0;
    local_17b0 = local_16d0;
    for (local_17fc = 0; local_17fc + 7 < local_17a4; local_17fc = local_17fc + 8) {
      local_1748 = local_17b0;
      auVar3 = *local_17b0;
      local_1668 = local_1789;
      local_1670 = local_1820;
      local_1820._0_8_ = auVar3._0_8_;
      local_12c0 = local_1820._0_8_;
      local_1820._8_8_ = auVar3._8_8_;
      uStack_12b8 = local_1820._8_8_;
      local_1820._16_8_ = auVar3._16_8_;
      uStack_12b0 = local_1820._16_8_;
      local_1820._24_8_ = auVar3._24_8_;
      uStack_12a8 = local_1820._24_8_;
      local_aa4 = 0x80000000;
      local_a80 = 0x80000000;
      auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
      local_aa0 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
      auStack_a90 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
      local_12e0 = local_aa0._0_8_;
      uStack_12d8 = local_aa0._8_8_;
      uStack_12d0 = auStack_a90._0_8_;
      uStack_12c8 = auStack_a90._8_8_;
      local_aa8 = 0x3f000000;
      local_a40 = 0x3f000000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x20);
      local_a60 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x20);
      auStack_a50 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x30);
      local_1300 = local_a60._0_8_;
      uStack_12f8 = local_a60._8_8_;
      uStack_12f0 = auStack_a50._0_8_;
      uStack_12e8 = auStack_a50._8_8_;
      local_aac = 0x3f800000;
      local_a00 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_a20 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_a10 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_1320 = local_a20._0_8_;
      uStack_1318 = local_a20._8_8_;
      uStack_1310 = auStack_a10._0_8_;
      uStack_1308 = auStack_a10._8_8_;
      local_ab0 = 0x3cc48f19;
      local_9c0 = 0x3cc48f19;
      auVar2 = vinsertps_avx(ZEXT416(0x3cc48f19),ZEXT416(0x3cc48f19),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3cc48f19),0x20);
      local_9e0 = vinsertps_avx(auVar2,ZEXT416(0x3cc48f19),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3cc48f19),ZEXT416(0x3cc48f19),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3cc48f19),0x20);
      auStack_9d0 = vinsertps_avx(auVar2,ZEXT416(0x3cc48f19),0x30);
      local_1340 = local_9e0._0_8_;
      uStack_1338 = local_9e0._8_8_;
      uStack_1330 = auStack_9d0._0_8_;
      uStack_1328 = auStack_9d0._8_8_;
      local_ab4 = 0x3d2dbdcf;
      local_980 = 0x3d2dbdcf;
      auVar2 = vinsertps_avx(ZEXT416(0x3d2dbdcf),ZEXT416(0x3d2dbdcf),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2dbdcf),0x20);
      local_9a0 = vinsertps_avx(auVar2,ZEXT416(0x3d2dbdcf),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d2dbdcf),ZEXT416(0x3d2dbdcf),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2dbdcf),0x20);
      auStack_990 = vinsertps_avx(auVar2,ZEXT416(0x3d2dbdcf),0x30);
      local_1360 = local_9a0._0_8_;
      uStack_1358 = local_9a0._8_8_;
      uStack_1350 = auStack_990._0_8_;
      uStack_1348 = auStack_990._8_8_;
      local_ab8 = 0x3d997dcc;
      local_940 = 0x3d997dcc;
      auVar2 = vinsertps_avx(ZEXT416(0x3d997dcc),ZEXT416(0x3d997dcc),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d997dcc),0x20);
      local_960 = vinsertps_avx(auVar2,ZEXT416(0x3d997dcc),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d997dcc),ZEXT416(0x3d997dcc),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d997dcc),0x20);
      auStack_950 = vinsertps_avx(auVar2,ZEXT416(0x3d997dcc),0x30);
      local_1380 = local_960._0_8_;
      uStack_1378 = local_960._8_8_;
      uStack_1370 = auStack_950._0_8_;
      uStack_1368 = auStack_950._8_8_;
      local_abc = 0x3d3a73d8;
      local_900 = 0x3d3a73d8;
      auVar2 = vinsertps_avx(ZEXT416(0x3d3a73d8),ZEXT416(0x3d3a73d8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d3a73d8),0x20);
      local_920 = vinsertps_avx(auVar2,ZEXT416(0x3d3a73d8),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d3a73d8),ZEXT416(0x3d3a73d8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d3a73d8),0x20);
      auStack_910 = vinsertps_avx(auVar2,ZEXT416(0x3d3a73d8),0x30);
      local_13a0 = local_920._0_8_;
      uStack_1398 = local_920._8_8_;
      uStack_1390 = auStack_910._0_8_;
      uStack_1388 = auStack_910._8_8_;
      local_ac0 = 0x3f800000;
      local_8c0 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_8e0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_8d0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_13c0 = local_8e0._0_8_;
      uStack_13b8 = local_8e0._8_8_;
      uStack_13b0 = auStack_8d0._0_8_;
      uStack_13a8 = auStack_8d0._8_8_;
      local_ac4 = 0x3e2aaaf8;
      local_880 = 0x3e2aaaf8;
      auVar2 = vinsertps_avx(ZEXT416(0x3e2aaaf8),ZEXT416(0x3e2aaaf8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e2aaaf8),0x20);
      local_8a0 = vinsertps_avx(auVar2,ZEXT416(0x3e2aaaf8),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3e2aaaf8),ZEXT416(0x3e2aaaf8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e2aaaf8),0x20);
      auStack_890 = vinsertps_avx(auVar2,ZEXT416(0x3e2aaaf8),0x30);
      local_13e0 = local_8a0._0_8_;
      uStack_13d8 = local_8a0._8_8_;
      uStack_13d0 = auStack_890._0_8_;
      uStack_13c8 = auStack_890._8_8_;
      local_ac8 = 0x3fc90fdb;
      local_840 = 0x3fc90fdb;
      auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
      local_860 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
      auStack_850 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
      local_1400 = local_860._0_8_;
      uStack_13f8 = local_860._8_8_;
      uStack_13f0 = auStack_850._0_8_;
      uStack_13e8 = auStack_850._8_8_;
      local_acc = 0x40400000;
      local_800 = 0x40400000;
      auVar2 = vinsertps_avx(ZEXT416(0x40400000),ZEXT416(0x40400000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40400000),0x20);
      local_820 = vinsertps_avx(auVar2,ZEXT416(0x40400000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x40400000),ZEXT416(0x40400000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40400000),0x20);
      auStack_810 = vinsertps_avx(auVar2,ZEXT416(0x40400000),0x30);
      local_1420 = local_820._0_8_;
      uStack_1418 = local_820._8_8_;
      uStack_1410 = auStack_810._0_8_;
      uStack_1408 = auStack_810._8_8_;
      local_1240 = local_aa0._0_8_;
      uStack_1238 = local_aa0._8_8_;
      uStack_1230 = auStack_a90._0_8_;
      uStack_1228 = auStack_a90._8_8_;
      auVar1._16_8_ = auStack_a90._0_8_;
      auVar1._0_16_ = local_aa0;
      auVar1._24_8_ = auStack_a90._8_8_;
      local_1440 = vandps_avx(auVar1,auVar3);
      local_b00 = local_aa0._0_8_;
      uStack_af8 = local_aa0._8_8_;
      uStack_af0 = auStack_a90._0_8_;
      uStack_ae8 = auStack_a90._8_8_;
      auVar9._16_8_ = auStack_a90._0_8_;
      auVar9._0_16_ = local_aa0;
      auVar9._24_8_ = auStack_a90._8_8_;
      auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      local_1460 = vandnps_avx(auVar9,auVar3);
      auVar3._16_8_ = auStack_a50._0_8_;
      auVar3._0_16_ = local_a60;
      auVar3._24_8_ = auStack_a50._8_8_;
      local_1480 = vcmpps_avx(local_1460,auVar3,2);
      local_b40 = local_1480._0_8_;
      uStack_b38 = local_1480._8_8_;
      uStack_b30 = local_1480._16_8_;
      uStack_b28 = local_1480._24_8_;
      local_b60 = local_a20._0_8_;
      uStack_b58 = local_a20._8_8_;
      uStack_b50 = auStack_a10._0_8_;
      uStack_b48 = auStack_a10._8_8_;
      auVar8._16_8_ = auStack_a10._0_8_;
      auVar8._0_16_ = local_a20;
      auVar8._24_8_ = auStack_a10._8_8_;
      local_14a0 = vandnps_avx(local_1480,auVar8);
      local_1200 = local_a20._0_8_;
      uStack_11f8 = local_a20._8_8_;
      uStack_11f0 = auStack_a10._0_8_;
      uStack_11e8 = auStack_a10._8_8_;
      local_1220 = local_1460._0_8_;
      uStack_1218 = local_1460._8_8_;
      uStack_1210 = local_1460._16_8_;
      uStack_1208 = local_1460._24_8_;
      auVar4._16_8_ = auStack_a10._0_8_;
      auVar4._0_16_ = local_a20;
      auVar4._24_8_ = auStack_a10._8_8_;
      _local_10e0 = vsubps_avx(auVar4,local_1460);
      local_10c0._0_4_ = local_a60._0_4_;
      local_10c0._4_4_ = local_a60._4_4_;
      uStack_10b8._0_4_ = local_a60._8_4_;
      uStack_10b8._4_4_ = local_a60._12_4_;
      uStack_10b0._0_4_ = auStack_a50._0_4_;
      uStack_10b0._4_4_ = auStack_a50._4_4_;
      uStack_10a8._0_4_ = auStack_a50._8_4_;
      uStack_10a8._4_4_ = auStack_a50._12_4_;
      uStack_1084 = uStack_10a8._4_4_;
      local_10a0 = (float)local_10c0 * (float)local_10e0._0_4_;
      fStack_109c = local_10c0._4_4_ * (float)local_10e0._4_4_;
      fStack_1098 = (float)uStack_10b8 * fStack_10d8;
      fStack_1094 = uStack_10b8._4_4_ * fStack_10d4;
      fStack_1090 = (float)uStack_10b0 * fStack_10d0;
      fStack_108c = uStack_10b0._4_4_ * fStack_10cc;
      fStack_1088 = (float)uStack_10a8 * fStack_10c8;
      auVar5._4_4_ = fStack_109c;
      auVar5._0_4_ = local_10a0;
      auVar5._8_4_ = fStack_1098;
      auVar5._12_4_ = fStack_1094;
      auVar5._16_4_ = fStack_1090;
      auVar5._20_4_ = fStack_108c;
      auVar5._24_4_ = fStack_1088;
      auVar5._28_4_ = uStack_10a8._4_4_;
      local_14c0 = vsqrtps_avx(auVar5);
      local_1280 = local_1480._0_8_;
      uStack_1278 = local_1480._8_8_;
      uStack_1270 = local_1480._16_8_;
      uStack_1268 = local_1480._24_8_;
      local_12a0 = local_1460._0_8_;
      uStack_1298 = local_1460._8_8_;
      uStack_1290 = local_1460._16_8_;
      uStack_1288 = local_1460._24_8_;
      local_bc0 = vandps_avx(local_1480,local_1460);
      local_ba0 = local_14c0._0_8_;
      uStack_b98 = local_14c0._8_8_;
      uStack_b90 = local_14c0._16_8_;
      uStack_b88 = local_14c0._24_8_;
      local_b80._0_4_ = local_1480._0_4_;
      local_b80._4_4_ = local_1480._4_4_;
      local_b80._8_4_ = local_1480._8_4_;
      local_b80._12_4_ = local_1480._12_4_;
      local_b80._16_4_ = local_1480._16_4_;
      local_b80._20_4_ = local_1480._20_4_;
      local_b80._24_4_ = local_1480._24_4_;
      local_b80._28_4_ = local_1480._28_4_;
      auVar21._0_4_ = local_b80._0_4_ ^ auVar1._0_4_;
      auVar21._4_4_ = local_b80._4_4_ ^ auVar1._4_4_;
      auVar21._8_4_ = local_b80._8_4_ ^ auVar1._8_4_;
      auVar21._12_4_ = local_b80._12_4_ ^ auVar1._12_4_;
      auVar21._16_4_ = local_b80._16_4_ ^ auVar1._16_4_;
      auVar21._20_4_ = local_b80._20_4_ ^ auVar1._20_4_;
      auVar21._24_4_ = local_b80._24_4_ ^ auVar1._24_4_;
      auVar21._28_4_ = local_b80._28_4_ ^ auVar1._28_4_;
      local_be0 = vandps_avx(auVar21,local_14c0);
      local_14e0 = vorps_avx(local_bc0,local_be0);
      local_1120 = local_14e0._0_8_;
      uStack_1118 = local_14e0._8_8_;
      uStack_1110 = local_14e0._16_8_;
      uStack_1108 = local_14e0._24_8_;
      local_1100._0_4_ = local_14e0._0_4_;
      local_1100._4_4_ = local_14e0._4_4_;
      uStack_10f8._0_4_ = local_14e0._8_4_;
      uStack_10f8._4_4_ = local_14e0._12_4_;
      uStack_10f0._0_4_ = local_14e0._16_4_;
      uStack_10f0._4_4_ = local_14e0._20_4_;
      uStack_10e8._0_4_ = local_14e0._24_4_;
      uStack_10e8._4_4_ = local_14e0._28_4_;
      fStack_14e4 = uStack_10e8._4_4_;
      local_1500 = (float)local_1100 * (float)local_1100;
      fStack_14fc = local_1100._4_4_ * local_1100._4_4_;
      fStack_14f8 = (float)uStack_10f8 * (float)uStack_10f8;
      fStack_14f4 = uStack_10f8._4_4_ * uStack_10f8._4_4_;
      fStack_14f0 = (float)uStack_10f0 * (float)uStack_10f0;
      fStack_14ec = uStack_10f0._4_4_ * uStack_10f0._4_4_;
      fStack_14e8 = (float)uStack_10e8 * (float)uStack_10e8;
      local_1140 = CONCAT44(fStack_14fc,local_1500);
      uStack_1138 = CONCAT44(fStack_14f4,fStack_14f8);
      uStack_1130 = CONCAT44(fStack_14ec,fStack_14f0);
      uStack_1128 = CONCAT44(uStack_10e8._4_4_,fStack_14e8);
      local_1160 = CONCAT44(fStack_14fc,local_1500);
      uStack_1158 = CONCAT44(fStack_14f4,fStack_14f8);
      uStack_1150 = CONCAT44(fStack_14ec,fStack_14f0);
      uStack_1148 = CONCAT44(uStack_10e8._4_4_,fStack_14e8);
      fStack_1504 = uStack_10e8._4_4_;
      local_1520 = local_1500 * local_1500;
      fStack_151c = fStack_14fc * fStack_14fc;
      fStack_1518 = fStack_14f8 * fStack_14f8;
      fStack_1514 = fStack_14f4 * fStack_14f4;
      fStack_1510 = fStack_14f0 * fStack_14f0;
      fStack_150c = fStack_14ec * fStack_14ec;
      fStack_1508 = fStack_14e8 * fStack_14e8;
      local_e88 = &local_1520;
      local_e90 = &local_1360;
      local_e98 = &local_13a0;
      fStack_e44 = uStack_10e8._4_4_;
      local_e80._0_4_ = local_9a0._0_4_;
      local_e80._4_4_ = local_9a0._4_4_;
      uStack_e78._0_4_ = local_9a0._8_4_;
      uStack_e78._4_4_ = local_9a0._12_4_;
      uStack_e70._0_4_ = auStack_990._0_4_;
      uStack_e70._4_4_ = auStack_990._4_4_;
      uStack_e68._0_4_ = auStack_990._8_4_;
      local_d80 = local_1520 * (float)local_e80;
      fStack_d7c = fStack_151c * local_e80._4_4_;
      fStack_d78 = fStack_1518 * (float)uStack_e78;
      fStack_d74 = fStack_1514 * uStack_e78._4_4_;
      fStack_d70 = fStack_1510 * (float)uStack_e70;
      fStack_d6c = fStack_150c * uStack_e70._4_4_;
      fStack_d68 = fStack_1508 * (float)uStack_e68;
      local_da0._0_4_ = local_920._0_4_;
      local_da0._4_4_ = local_920._4_4_;
      uStack_d98._0_4_ = local_920._8_4_;
      uStack_d98._4_4_ = local_920._12_4_;
      uStack_d90._0_4_ = auStack_910._0_4_;
      uStack_d90._4_4_ = auStack_910._4_4_;
      uStack_d88._0_4_ = auStack_910._8_4_;
      uStack_d88._4_4_ = auStack_910._12_4_;
      local_1580 = local_d80 + (float)local_da0;
      fStack_157c = fStack_d7c + local_da0._4_4_;
      fStack_1578 = fStack_d78 + (float)uStack_d98;
      fStack_1574 = fStack_d74 + uStack_d98._4_4_;
      fStack_1570 = fStack_d70 + (float)uStack_d90;
      fStack_156c = fStack_d6c + uStack_d90._4_4_;
      fStack_1568 = fStack_d68 + (float)uStack_d88;
      fStack_1564 = uStack_10e8._4_4_ + uStack_d88._4_4_;
      local_ee8 = &local_1520;
      local_ef0 = &local_1580;
      local_ef8 = &local_13e0;
      fStack_ea4 = uStack_10e8._4_4_;
      local_ee0 = CONCAT44(fStack_157c,local_1580);
      uStack_ed8 = CONCAT44(fStack_1574,fStack_1578);
      uStack_ed0 = CONCAT44(fStack_156c,fStack_1570);
      uStack_ec8 = CONCAT44(fStack_1564,fStack_1568);
      local_d40 = local_1520 * local_1580;
      fStack_d3c = fStack_151c * fStack_157c;
      fStack_d38 = fStack_1518 * fStack_1578;
      fStack_d34 = fStack_1514 * fStack_1574;
      fStack_d30 = fStack_1510 * fStack_1570;
      fStack_d2c = fStack_150c * fStack_156c;
      fStack_d28 = fStack_1508 * fStack_1568;
      local_d60._0_4_ = local_8a0._0_4_;
      local_d60._4_4_ = local_8a0._4_4_;
      uStack_d58._0_4_ = local_8a0._8_4_;
      uStack_d58._4_4_ = local_8a0._12_4_;
      uStack_d50._0_4_ = auStack_890._0_4_;
      uStack_d50._4_4_ = auStack_890._4_4_;
      uStack_d48._0_4_ = auStack_890._8_4_;
      uStack_d48._4_4_ = auStack_890._12_4_;
      local_1560 = local_d40 + (float)local_d60;
      fStack_155c = fStack_d3c + local_d60._4_4_;
      fStack_1558 = fStack_d38 + (float)uStack_d58;
      fStack_1554 = fStack_d34 + uStack_d58._4_4_;
      fStack_1550 = fStack_d30 + (float)uStack_d50;
      fStack_154c = fStack_d2c + uStack_d50._4_4_;
      fStack_1548 = fStack_d28 + (float)uStack_d48;
      fStack_1544 = uStack_10e8._4_4_ + uStack_d48._4_4_;
      local_f48 = &local_1520;
      local_f50 = &local_1340;
      local_f58 = &local_1380;
      fStack_f04 = uStack_10e8._4_4_;
      local_f40._0_4_ = local_9e0._0_4_;
      local_f40._4_4_ = local_9e0._4_4_;
      uStack_f38._0_4_ = local_9e0._8_4_;
      uStack_f38._4_4_ = local_9e0._12_4_;
      uStack_f30._0_4_ = auStack_9d0._0_4_;
      uStack_f30._4_4_ = auStack_9d0._4_4_;
      uStack_f28._0_4_ = auStack_9d0._8_4_;
      local_d00 = local_1520 * (float)local_f40;
      fStack_cfc = fStack_151c * local_f40._4_4_;
      fStack_cf8 = fStack_1518 * (float)uStack_f38;
      fStack_cf4 = fStack_1514 * uStack_f38._4_4_;
      fStack_cf0 = fStack_1510 * (float)uStack_f30;
      fStack_cec = fStack_150c * uStack_f30._4_4_;
      fStack_ce8 = fStack_1508 * (float)uStack_f28;
      local_d20._0_4_ = local_960._0_4_;
      local_d20._4_4_ = local_960._4_4_;
      uStack_d18._0_4_ = local_960._8_4_;
      uStack_d18._4_4_ = local_960._12_4_;
      uStack_d10._0_4_ = auStack_950._0_4_;
      uStack_d10._4_4_ = auStack_950._4_4_;
      uStack_d08._0_4_ = auStack_950._8_4_;
      uStack_d08._4_4_ = auStack_950._12_4_;
      local_15c0 = local_d00 + (float)local_d20;
      fStack_15bc = fStack_cfc + local_d20._4_4_;
      fStack_15b8 = fStack_cf8 + (float)uStack_d18;
      fStack_15b4 = fStack_cf4 + uStack_d18._4_4_;
      fStack_15b0 = fStack_cf0 + (float)uStack_d10;
      fStack_15ac = fStack_cec + uStack_d10._4_4_;
      fStack_15a8 = fStack_ce8 + (float)uStack_d08;
      fStack_15a4 = uStack_10e8._4_4_ + uStack_d08._4_4_;
      local_fa8 = &local_1520;
      local_fb0 = &local_15c0;
      local_fb8 = &local_13c0;
      fStack_f64 = uStack_10e8._4_4_;
      local_fa0 = CONCAT44(fStack_15bc,local_15c0);
      uStack_f98 = CONCAT44(fStack_15b4,fStack_15b8);
      uStack_f90 = CONCAT44(fStack_15ac,fStack_15b0);
      uStack_f88 = CONCAT44(fStack_15a4,fStack_15a8);
      local_cc0 = local_1520 * local_15c0;
      fStack_cbc = fStack_151c * fStack_15bc;
      fStack_cb8 = fStack_1518 * fStack_15b8;
      fStack_cb4 = fStack_1514 * fStack_15b4;
      fStack_cb0 = fStack_1510 * fStack_15b0;
      fStack_cac = fStack_150c * fStack_15ac;
      fStack_ca8 = fStack_1508 * fStack_15a8;
      local_ce0._0_4_ = local_8e0._0_4_;
      local_ce0._4_4_ = local_8e0._4_4_;
      uStack_cd8._0_4_ = local_8e0._8_4_;
      uStack_cd8._4_4_ = local_8e0._12_4_;
      uStack_cd0._0_4_ = auStack_8d0._0_4_;
      uStack_cd0._4_4_ = auStack_8d0._4_4_;
      uStack_cc8._0_4_ = auStack_8d0._8_4_;
      uStack_cc8._4_4_ = auStack_8d0._12_4_;
      local_15a0 = local_cc0 + (float)local_ce0;
      fStack_159c = fStack_cbc + local_ce0._4_4_;
      fStack_1598 = fStack_cb8 + (float)uStack_cd8;
      fStack_1594 = fStack_cb4 + uStack_cd8._4_4_;
      fStack_1590 = fStack_cb0 + (float)uStack_cd0;
      fStack_158c = fStack_cac + uStack_cd0._4_4_;
      fStack_1588 = fStack_ca8 + (float)uStack_cc8;
      fStack_1584 = uStack_10e8._4_4_ + uStack_cc8._4_4_;
      local_1008 = &local_1500;
      local_1010 = &local_1560;
      local_1018 = &local_15a0;
      fStack_fc4 = uStack_10e8._4_4_;
      local_1000 = CONCAT44(fStack_155c,local_1560);
      uStack_ff8 = CONCAT44(fStack_1554,fStack_1558);
      uStack_ff0 = CONCAT44(fStack_154c,fStack_1550);
      uStack_fe8 = CONCAT44(fStack_1544,fStack_1548);
      local_c80 = local_1500 * local_1560;
      fStack_c7c = fStack_14fc * fStack_155c;
      fStack_c78 = fStack_14f8 * fStack_1558;
      fStack_c74 = fStack_14f4 * fStack_1554;
      fStack_c70 = fStack_14f0 * fStack_1550;
      fStack_c6c = fStack_14ec * fStack_154c;
      fStack_c68 = fStack_14e8 * fStack_1548;
      local_ca0 = CONCAT44(fStack_159c,local_15a0);
      uStack_c98 = CONCAT44(fStack_1594,fStack_1598);
      uStack_c90 = CONCAT44(fStack_158c,fStack_1590);
      uStack_c88 = CONCAT44(fStack_1584,fStack_1588);
      local_1540 = local_c80 + local_15a0;
      fStack_153c = fStack_c7c + fStack_159c;
      fStack_1538 = fStack_c78 + fStack_1598;
      fStack_1534 = fStack_c74 + fStack_1594;
      fStack_1530 = fStack_c70 + fStack_1590;
      fStack_152c = fStack_c6c + fStack_158c;
      fStack_1528 = fStack_c68 + fStack_1588;
      fStack_15e4 = uStack_10e8._4_4_ + fStack_1584;
      local_1180 = CONCAT44(fStack_153c,local_1540);
      uStack_1178 = CONCAT44(fStack_1534,fStack_1538);
      uStack_1170 = CONCAT44(fStack_152c,fStack_1530);
      uStack_1168 = CONCAT44(fStack_15e4,fStack_1528);
      local_11a0 = local_14e0._0_8_;
      uStack_1198 = local_14e0._8_8_;
      uStack_1190 = local_14e0._16_8_;
      uStack_1188 = local_14e0._24_8_;
      local_1600 = local_1540 * (float)local_1100;
      fStack_15fc = fStack_153c * local_1100._4_4_;
      fStack_15f8 = fStack_1538 * (float)uStack_10f8;
      fStack_15f4 = fStack_1534 * uStack_10f8._4_4_;
      fStack_15f0 = fStack_1530 * (float)uStack_10f0;
      fStack_15ec = fStack_152c * uStack_10f0._4_4_;
      fStack_15e8 = fStack_1528 * (float)uStack_10e8;
      local_e28 = &local_1420;
      local_e30 = local_14a0;
      local_e38 = &local_1320;
      local_e00 = local_a20._0_8_;
      uStack_df8 = local_a20._8_8_;
      uStack_df0 = auStack_a10._0_8_;
      uStack_de8 = auStack_a10._8_8_;
      auVar18._16_8_ = auStack_a10._0_8_;
      auVar18._0_16_ = local_a20;
      auVar18._24_8_ = auStack_a10._8_8_;
      auVar17._16_8_ = auStack_810._0_8_;
      auVar17._0_16_ = local_820;
      auVar17._24_8_ = auStack_810._8_8_;
      in_ZMM2 = ZEXT3264(auVar17);
      local_dc0._0_4_ = local_820._0_4_;
      local_dc0._4_4_ = local_820._4_4_;
      fStack_db8 = local_820._8_4_;
      fStack_db4 = local_820._12_4_;
      fStack_db0 = auStack_810._0_4_;
      fStack_dac = auStack_810._4_4_;
      fStack_da8 = auStack_810._8_4_;
      uStack_da4 = auStack_810._12_4_;
      uStack_e04 = uStack_da4;
      local_de0._0_4_ = local_14a0._0_4_;
      local_de0._4_4_ = local_14a0._4_4_;
      uStack_dd8._0_4_ = local_14a0._8_4_;
      uStack_dd8._4_4_ = local_14a0._12_4_;
      uStack_dd0._0_4_ = local_14a0._16_4_;
      uStack_dd0._4_4_ = local_14a0._20_4_;
      uStack_dc8._0_4_ = local_14a0._24_4_;
      local_e20 = (float)local_dc0._0_4_ * (float)local_de0;
      fStack_e1c = (float)local_dc0._4_4_ * local_de0._4_4_;
      fStack_e18 = fStack_db8 * (float)uStack_dd8;
      fStack_e14 = fStack_db4 * uStack_dd8._4_4_;
      fStack_e10 = fStack_db0 * (float)uStack_dd0;
      fStack_e0c = fStack_dac * uStack_dd0._4_4_;
      fStack_e08 = fStack_da8 * (float)uStack_dc8;
      auVar6._4_4_ = fStack_e1c;
      auVar6._0_4_ = local_e20;
      auVar6._8_4_ = fStack_e18;
      auVar6._12_4_ = fStack_e14;
      auVar6._16_4_ = fStack_e10;
      auVar6._20_4_ = fStack_e0c;
      auVar6._24_4_ = fStack_e08;
      auVar6._28_4_ = uStack_da4;
      local_1620 = vsubps_avx(auVar18,auVar6);
      local_11e0 = local_14a0._0_8_;
      uStack_11d8 = local_14a0._8_8_;
      uStack_11d0 = local_14a0._16_8_;
      uStack_11c8 = local_14a0._24_8_;
      local_11c0._0_4_ = local_860._0_4_;
      local_11c0._4_4_ = local_860._4_4_;
      uStack_11b8._0_4_ = local_860._8_4_;
      uStack_11b8._4_4_ = local_860._12_4_;
      uStack_11b0._0_4_ = auStack_850._0_4_;
      uStack_11b0._4_4_ = auStack_850._4_4_;
      uStack_11a8._0_4_ = auStack_850._8_4_;
      uStack_11a8._4_4_ = auStack_850._12_4_;
      fStack_1624 = uStack_11a8._4_4_;
      local_1640 = (float)local_11c0 * (float)local_de0;
      fStack_163c = local_11c0._4_4_ * local_de0._4_4_;
      fStack_1638 = (float)uStack_11b8 * (float)uStack_dd8;
      fStack_1634 = uStack_11b8._4_4_ * uStack_dd8._4_4_;
      fStack_1630 = (float)uStack_11b0 * (float)uStack_dd0;
      fStack_162c = uStack_11b0._4_4_ * uStack_dd0._4_4_;
      fStack_1628 = (float)uStack_11a8 * (float)uStack_dc8;
      local_1068 = &local_1600;
      local_1070 = local_1620;
      local_1078 = &local_1640;
      local_1060._0_4_ = local_1620._0_4_;
      local_1060._4_4_ = local_1620._4_4_;
      uStack_1058._0_4_ = local_1620._8_4_;
      uStack_1058._4_4_ = local_1620._12_4_;
      uStack_1050._0_4_ = local_1620._16_4_;
      uStack_1050._4_4_ = local_1620._20_4_;
      uStack_1048._0_4_ = local_1620._24_4_;
      local_c40 = local_1600 * (float)local_1060;
      fStack_c3c = fStack_15fc * local_1060._4_4_;
      fStack_c38 = fStack_15f8 * (float)uStack_1058;
      fStack_c34 = fStack_15f4 * uStack_1058._4_4_;
      fStack_c30 = fStack_15f0 * (float)uStack_1050;
      fStack_c2c = fStack_15ec * uStack_1050._4_4_;
      fStack_c28 = fStack_15e8 * (float)uStack_1048;
      local_c60 = CONCAT44(fStack_163c,local_1640);
      uStack_c58 = CONCAT44(fStack_1634,fStack_1638);
      uStack_c50 = CONCAT44(fStack_162c,fStack_1630);
      uStack_c48 = CONCAT44(uStack_11a8._4_4_,fStack_1628);
      local_15e0 = local_c40 + local_1640;
      fStack_15dc = fStack_c3c + fStack_163c;
      fStack_15d8 = fStack_c38 + fStack_1638;
      fStack_15d4 = fStack_c34 + fStack_1634;
      fStack_15d0 = fStack_c30 + fStack_1630;
      fStack_15cc = fStack_c2c + fStack_162c;
      fStack_15c8 = fStack_c28 + fStack_1628;
      fStack_15c4 = fStack_15e4 + uStack_11a8._4_4_;
      local_c00 = CONCAT44(fStack_15dc,local_15e0);
      uStack_bf8 = CONCAT44(fStack_15d4,fStack_15d8);
      uStack_bf0 = CONCAT44(fStack_15cc,fStack_15d0);
      uStack_be8 = CONCAT44(fStack_15c4,fStack_15c8);
      local_c20 = local_1440._0_8_;
      uStack_c18 = local_1440._8_8_;
      uStack_c10 = local_1440._16_8_;
      uStack_c08 = local_1440._24_8_;
      auVar7._8_8_ = uStack_bf8;
      auVar7._0_8_ = local_c00;
      auVar7._16_8_ = uStack_bf0;
      auVar7._24_8_ = uStack_be8;
      local_1820 = vorps_avx(auVar7,local_1440);
      local_1710 = local_17b0;
      local_1740 = local_1820._0_8_;
      uStack_1738 = local_1820._8_8_;
      uStack_1730 = local_1820._16_8_;
      uStack_1728 = local_1820._24_8_;
      *local_17b0 = local_1820;
      local_17b0 = local_17b0 + 1;
      fStack_1524 = fStack_15e4;
      local_1260 = local_12c0;
      uStack_1258 = uStack_12b8;
      uStack_1250 = uStack_12b0;
      uStack_1248 = uStack_12a8;
      local_11c0 = local_860._0_8_;
      uStack_11b8 = local_860._8_8_;
      uStack_11b0 = auStack_850._0_8_;
      uStack_11a8 = auStack_850._8_8_;
      local_1100 = local_14e0._0_8_;
      uStack_10f8 = local_14e0._8_8_;
      uStack_10f0 = local_14e0._16_8_;
      uStack_10e8 = local_14e0._24_8_;
      local_10c0 = local_a60._0_8_;
      uStack_10b8 = local_a60._8_8_;
      uStack_10b0 = auStack_a50._0_8_;
      uStack_10a8 = auStack_a50._8_8_;
      local_1060 = local_1620._0_8_;
      uStack_1058 = local_1620._8_8_;
      uStack_1050 = local_1620._16_8_;
      uStack_1048 = local_1620._24_8_;
      local_1040 = local_1600;
      fStack_103c = fStack_15fc;
      fStack_1038 = fStack_15f8;
      fStack_1034 = fStack_15f4;
      fStack_1030 = fStack_15f0;
      fStack_102c = fStack_15ec;
      fStack_1028 = fStack_15e8;
      fStack_1024 = fStack_15e4;
      local_fe0 = local_1500;
      fStack_fdc = fStack_14fc;
      fStack_fd8 = fStack_14f8;
      fStack_fd4 = fStack_14f4;
      fStack_fd0 = fStack_14f0;
      fStack_fcc = fStack_14ec;
      fStack_fc8 = fStack_14e8;
      local_f80 = local_1520;
      fStack_f7c = fStack_151c;
      fStack_f78 = fStack_1518;
      fStack_f74 = fStack_1514;
      fStack_f70 = fStack_1510;
      fStack_f6c = fStack_150c;
      fStack_f68 = fStack_1508;
      local_f40 = local_9e0._0_8_;
      uStack_f38 = local_9e0._8_8_;
      uStack_f30 = auStack_9d0._0_8_;
      uStack_f28 = auStack_9d0._8_8_;
      local_f20 = local_1520;
      fStack_f1c = fStack_151c;
      fStack_f18 = fStack_1518;
      fStack_f14 = fStack_1514;
      fStack_f10 = fStack_1510;
      fStack_f0c = fStack_150c;
      fStack_f08 = fStack_1508;
      local_ec0 = local_1520;
      fStack_ebc = fStack_151c;
      fStack_eb8 = fStack_1518;
      fStack_eb4 = fStack_1514;
      fStack_eb0 = fStack_1510;
      fStack_eac = fStack_150c;
      fStack_ea8 = fStack_1508;
      local_e80 = local_9a0._0_8_;
      uStack_e78 = local_9a0._8_8_;
      uStack_e70 = auStack_990._0_8_;
      uStack_e68 = auStack_990._8_8_;
      local_e60 = local_1520;
      fStack_e5c = fStack_151c;
      fStack_e58 = fStack_1518;
      fStack_e54 = fStack_1514;
      fStack_e50 = fStack_1510;
      fStack_e4c = fStack_150c;
      fStack_e48 = fStack_1508;
      local_de0 = local_14a0._0_8_;
      uStack_dd8 = local_14a0._8_8_;
      uStack_dd0 = local_14a0._16_8_;
      uStack_dc8 = local_14a0._24_8_;
      _local_dc0 = auVar17;
      local_da0 = local_920._0_8_;
      uStack_d98 = local_920._8_8_;
      uStack_d90 = auStack_910._0_8_;
      uStack_d88 = auStack_910._8_8_;
      fStack_d64 = fStack_e44;
      local_d60 = local_8a0._0_8_;
      uStack_d58 = local_8a0._8_8_;
      uStack_d50 = auStack_890._0_8_;
      uStack_d48 = auStack_890._8_8_;
      fStack_d24 = fStack_ea4;
      local_d20 = local_960._0_8_;
      uStack_d18 = local_960._8_8_;
      uStack_d10 = auStack_950._0_8_;
      uStack_d08 = auStack_950._8_8_;
      fStack_ce4 = fStack_f04;
      local_ce0 = local_8e0._0_8_;
      uStack_cd8 = local_8e0._8_8_;
      uStack_cd0 = auStack_8d0._0_8_;
      uStack_cc8 = auStack_8d0._8_8_;
      fStack_ca4 = fStack_f64;
      fStack_c64 = fStack_fc4;
      fStack_c24 = fStack_15e4;
      local_b80 = local_1480;
      local_b20 = local_12c0;
      uStack_b18 = uStack_12b8;
      uStack_b10 = uStack_12b0;
      uStack_b08 = uStack_12a8;
      local_a7c = local_a80;
      local_a78 = local_a80;
      local_a74 = local_a80;
      local_a70 = local_a80;
      local_a6c = local_a80;
      local_a68 = local_a80;
      local_a64 = local_a80;
      local_a3c = local_a40;
      local_a38 = local_a40;
      local_a34 = local_a40;
      local_a30 = local_a40;
      local_a2c = local_a40;
      local_a28 = local_a40;
      local_a24 = local_a40;
      local_9fc = local_a00;
      local_9f8 = local_a00;
      local_9f4 = local_a00;
      local_9f0 = local_a00;
      local_9ec = local_a00;
      local_9e8 = local_a00;
      local_9e4 = local_a00;
      local_9bc = local_9c0;
      local_9b8 = local_9c0;
      local_9b4 = local_9c0;
      local_9b0 = local_9c0;
      local_9ac = local_9c0;
      local_9a8 = local_9c0;
      local_9a4 = local_9c0;
      local_97c = local_980;
      local_978 = local_980;
      local_974 = local_980;
      local_970 = local_980;
      local_96c = local_980;
      local_968 = local_980;
      local_964 = local_980;
      local_93c = local_940;
      local_938 = local_940;
      local_934 = local_940;
      local_930 = local_940;
      local_92c = local_940;
      local_928 = local_940;
      local_924 = local_940;
      local_8fc = local_900;
      local_8f8 = local_900;
      local_8f4 = local_900;
      local_8f0 = local_900;
      local_8ec = local_900;
      local_8e8 = local_900;
      local_8e4 = local_900;
      local_8bc = local_8c0;
      local_8b8 = local_8c0;
      local_8b4 = local_8c0;
      local_8b0 = local_8c0;
      local_8ac = local_8c0;
      local_8a8 = local_8c0;
      local_8a4 = local_8c0;
      local_87c = local_880;
      local_878 = local_880;
      local_874 = local_880;
      local_870 = local_880;
      local_86c = local_880;
      local_868 = local_880;
      local_864 = local_880;
      local_83c = local_840;
      local_838 = local_840;
      local_834 = local_840;
      local_830 = local_840;
      local_82c = local_840;
      local_828 = local_840;
      local_824 = local_840;
      local_7fc = local_800;
      local_7f8 = local_800;
      local_7f4 = local_800;
      local_7f0 = local_800;
      local_7ec = local_800;
      local_7e8 = local_800;
      local_7e4 = local_800;
    }
    for (; local_1698 = local_1750, local_17d8 = local_16e8, local_17fc + 3 < local_17a4;
        local_17fc = local_17fc + 4) {
      local_1708 = local_17b0;
      auVar10 = *(undefined1 (*) [16])*local_17b0;
      local_1658 = local_1789;
      local_1660 = local_1830;
      local_1830._0_8_ = auVar10._0_8_;
      local_620 = local_1830._0_8_;
      local_1830._8_8_ = auVar10._8_8_;
      uStack_618 = local_1830._8_8_;
      local_54 = 0x80000000;
      local_34 = 0x80000000;
      local_50 = 0x80000000;
      local_630 = 0x8000000080000000;
      uStack_628 = 0x8000000080000000;
      local_74 = 0x3f000000;
      local_58 = 0x3f000000;
      local_70 = 0x3f000000;
      local_640 = 0x3f0000003f000000;
      uStack_638 = 0x3f0000003f000000;
      local_94 = 0x3f800000;
      local_78 = 0x3f800000;
      local_90 = 0x3f800000;
      local_650 = 0x3f8000003f800000;
      uStack_648 = 0x3f8000003f800000;
      local_b4 = 0x3cc48f19;
      local_98 = 0x3cc48f19;
      local_b0 = 0x3cc48f19;
      local_660 = 0x3cc48f193cc48f19;
      uStack_658 = 0x3cc48f193cc48f19;
      local_d4 = 0x3d2dbdcf;
      local_b8 = 0x3d2dbdcf;
      local_d0 = 0x3d2dbdcf;
      local_670 = 0x3d2dbdcf3d2dbdcf;
      uStack_668 = 0x3d2dbdcf3d2dbdcf;
      local_f4 = 0x3d997dcc;
      local_d8 = 0x3d997dcc;
      local_f0 = 0x3d997dcc;
      local_680 = 0x3d997dcc3d997dcc;
      uStack_678 = 0x3d997dcc3d997dcc;
      local_114 = 0x3d3a73d8;
      local_f8 = 0x3d3a73d8;
      local_110 = 0x3d3a73d8;
      local_690 = 0x3d3a73d83d3a73d8;
      uStack_688 = 0x3d3a73d83d3a73d8;
      local_134 = 0x3f800000;
      local_118 = 0x3f800000;
      local_130 = 0x3f800000;
      local_6a0 = 0x3f8000003f800000;
      uStack_698 = 0x3f8000003f800000;
      local_154 = 0x3e2aaaf8;
      local_138 = 0x3e2aaaf8;
      local_150 = 0x3e2aaaf8;
      local_6b0 = 0x3e2aaaf83e2aaaf8;
      uStack_6a8 = 0x3e2aaaf83e2aaaf8;
      local_174 = 0x3fc90fdb;
      local_158 = 0x3fc90fdb;
      local_170 = 0x3fc90fdb;
      local_6c0 = 0x3fc90fdb3fc90fdb;
      uStack_6b8 = 0x3fc90fdb3fc90fdb;
      local_194 = 0x40400000;
      local_178 = 0x40400000;
      local_190 = 0x40400000;
      local_6d0 = 0x4040000040400000;
      uStack_6c8 = 0x4040000040400000;
      auVar2._8_8_ = 0x8000000080000000;
      auVar2._0_8_ = 0x8000000080000000;
      local_6e0 = vpand_avx(auVar2,auVar10);
      auVar16._8_8_ = 0x8000000080000000;
      auVar16._0_8_ = 0x8000000080000000;
      auVar2 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      local_6f0 = vpandn_avx(auVar16,auVar10);
      local_250 = local_6f0._0_8_;
      uStack_248 = local_6f0._8_8_;
      auVar13._8_8_ = 0x3f0000003f000000;
      auVar13._0_8_ = 0x3f0000003f000000;
      local_700 = vcmpps_avx(local_6f0,auVar13,2);
      local_1d0 = local_700._0_8_;
      uStack_1c8 = local_700._8_8_;
      auVar15._8_8_ = 0x3f8000003f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      local_710 = vpandn_avx(local_700,auVar15);
      local_5d0 = local_6f0._0_8_;
      uStack_5c8 = local_6f0._8_8_;
      auVar10._8_8_ = 0x3f8000003f800000;
      auVar10._0_8_ = 0x3f8000003f800000;
      _local_530 = vsubps_avx(auVar10,local_6f0);
      local_510 = (float)local_530._0_4_ * 0.5;
      fStack_50c = (float)local_530._4_4_ * 0.5;
      fStack_508 = fStack_528 * 0.5;
      fStack_504 = fStack_524 * 0.5;
      auVar11._4_4_ = fStack_50c;
      auVar11._0_4_ = local_510;
      auVar11._8_4_ = fStack_508;
      auVar11._12_4_ = fStack_504;
      local_720 = vsqrtps_avx(auVar11);
      local_600 = local_700._0_8_;
      uStack_5f8 = local_700._8_8_;
      local_610 = local_6f0._0_8_;
      uStack_608 = local_6f0._8_8_;
      local_210 = vpand_avx(local_700,local_6f0);
      local_200 = local_720._0_8_;
      uStack_1f8 = local_720._8_8_;
      local_220 = vpand_avx(local_700 ^ auVar2,local_720);
      local_730 = vpor_avx(local_210,local_220);
      local_550 = local_730._0_8_;
      uStack_548 = local_730._8_8_;
      local_540._0_4_ = local_730._0_4_;
      local_540._4_4_ = local_730._4_4_;
      uStack_538._0_4_ = local_730._8_4_;
      uStack_538._4_4_ = local_730._12_4_;
      local_740 = (float)local_540 * (float)local_540;
      fStack_73c = local_540._4_4_ * local_540._4_4_;
      fStack_738 = (float)uStack_538 * (float)uStack_538;
      fStack_734 = uStack_538._4_4_ * uStack_538._4_4_;
      local_560 = CONCAT44(fStack_73c,local_740);
      uStack_558 = CONCAT44(fStack_734,fStack_738);
      local_570 = CONCAT44(fStack_73c,local_740);
      uStack_568 = CONCAT44(fStack_734,fStack_738);
      local_750 = local_740 * local_740;
      fStack_74c = fStack_73c * fStack_73c;
      fStack_748 = fStack_738 * fStack_738;
      fStack_744 = fStack_734 * fStack_734;
      local_2a8 = &local_750;
      local_2b0 = &local_670;
      local_2b8 = &local_690;
      local_290 = CONCAT44(fStack_74c,local_750);
      uStack_288 = CONCAT44(fStack_744,fStack_748);
      local_2a0 = 0x3d2dbdcf3d2dbdcf;
      uStack_298 = 0x3d2dbdcf3d2dbdcf;
      local_270 = local_750 * 0.042417344;
      fStack_26c = fStack_74c * 0.042417344;
      fStack_268 = fStack_748 * 0.042417344;
      fStack_264 = fStack_744 * 0.042417344;
      local_280 = 0x3d3a73d83d3a73d8;
      uStack_278 = 0x3d3a73d83d3a73d8;
      local_780 = local_270 + 0.045520633;
      fStack_77c = fStack_26c + 0.045520633;
      fStack_778 = fStack_268 + 0.045520633;
      fStack_774 = fStack_264 + 0.045520633;
      local_308 = &local_750;
      local_310 = &local_780;
      local_318 = &local_6b0;
      local_2f0 = CONCAT44(fStack_74c,local_750);
      uStack_2e8 = CONCAT44(fStack_744,fStack_748);
      local_300 = CONCAT44(fStack_77c,local_780);
      uStack_2f8 = CONCAT44(fStack_774,fStack_778);
      local_2d0 = local_750 * local_780;
      fStack_2cc = fStack_74c * fStack_77c;
      fStack_2c8 = fStack_748 * fStack_778;
      fStack_2c4 = fStack_744 * fStack_774;
      local_2e0 = 0x3e2aaaf83e2aaaf8;
      uStack_2d8 = 0x3e2aaaf83e2aaaf8;
      local_770 = local_2d0 + 0.16666782;
      fStack_76c = fStack_2cc + 0.16666782;
      fStack_768 = fStack_2c8 + 0.16666782;
      fStack_764 = fStack_2c4 + 0.16666782;
      local_368 = &local_750;
      local_370 = &local_660;
      local_378 = &local_680;
      local_350 = CONCAT44(fStack_74c,local_750);
      uStack_348 = CONCAT44(fStack_744,fStack_748);
      local_360 = 0x3cc48f193cc48f19;
      uStack_358 = 0x3cc48f193cc48f19;
      local_330 = local_750 * 0.023994016;
      fStack_32c = fStack_74c * 0.023994016;
      fStack_328 = fStack_748 * 0.023994016;
      fStack_324 = fStack_744 * 0.023994016;
      local_340 = 0x3d997dcc3d997dcc;
      uStack_338 = 0x3d997dcc3d997dcc;
      local_7a0 = local_330 + 0.07494697;
      fStack_79c = fStack_32c + 0.07494697;
      fStack_798 = fStack_328 + 0.07494697;
      fStack_794 = fStack_324 + 0.07494697;
      local_3c8 = &local_750;
      local_3d0 = &local_7a0;
      local_3d8 = &local_6a0;
      local_3b0 = CONCAT44(fStack_74c,local_750);
      uStack_3a8 = CONCAT44(fStack_744,fStack_748);
      local_3c0 = CONCAT44(fStack_79c,local_7a0);
      uStack_3b8 = CONCAT44(fStack_794,fStack_798);
      local_390 = local_750 * local_7a0;
      fStack_38c = fStack_74c * fStack_79c;
      fStack_388 = fStack_748 * fStack_798;
      fStack_384 = fStack_744 * fStack_794;
      local_3a0 = 0x3f8000003f800000;
      uStack_398 = 0x3f8000003f800000;
      local_790 = local_390 + 1.0;
      fStack_78c = fStack_38c + 1.0;
      fStack_788 = fStack_388 + 1.0;
      fStack_784 = fStack_384 + 1.0;
      local_428 = &local_740;
      local_430 = &local_770;
      local_438 = &local_790;
      local_410 = CONCAT44(fStack_73c,local_740);
      uStack_408 = CONCAT44(fStack_734,fStack_738);
      local_420 = CONCAT44(fStack_76c,local_770);
      uStack_418 = CONCAT44(fStack_764,fStack_768);
      local_3f0 = local_740 * local_770;
      fStack_3ec = fStack_73c * fStack_76c;
      fStack_3e8 = fStack_738 * fStack_768;
      fStack_3e4 = fStack_734 * fStack_764;
      local_400 = CONCAT44(fStack_78c,local_790);
      uStack_3f8 = CONCAT44(fStack_784,fStack_788);
      local_760 = local_3f0 + local_790;
      fStack_75c = fStack_3ec + fStack_78c;
      fStack_758 = fStack_3e8 + fStack_788;
      fStack_754 = fStack_3e4 + fStack_784;
      local_580 = CONCAT44(fStack_75c,local_760);
      uStack_578 = CONCAT44(fStack_754,fStack_758);
      local_590 = local_730._0_8_;
      uStack_588 = local_730._8_8_;
      local_7c0 = local_760 * (float)local_540;
      fStack_7bc = fStack_75c * local_540._4_4_;
      fStack_7b8 = fStack_758 * (float)uStack_538;
      fStack_7b4 = fStack_754 * uStack_538._4_4_;
      local_4e8 = &local_6d0;
      local_4f0 = local_710;
      local_4f8 = &local_650;
      local_4d0 = 0x3f8000003f800000;
      uStack_4c8 = 0x3f8000003f800000;
      auVar19._8_8_ = 0x3f8000003f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      local_4b0._8_8_ = 0x4040000040400000;
      local_4b0._0_8_ = 0x4040000040400000;
      in_ZMM2 = ZEXT1664(local_4b0);
      local_4c0._0_4_ = local_710._0_4_;
      local_4c0._4_4_ = local_710._4_4_;
      uStack_4b8._0_4_ = local_710._8_4_;
      uStack_4b8._4_4_ = local_710._12_4_;
      local_4e0 = (float)local_4c0 * 3.0;
      fStack_4dc = local_4c0._4_4_ * 3.0;
      fStack_4d8 = (float)uStack_4b8 * 3.0;
      fStack_4d4 = uStack_4b8._4_4_ * 3.0;
      auVar12._4_4_ = fStack_4dc;
      auVar12._0_4_ = local_4e0;
      auVar12._8_4_ = fStack_4d8;
      auVar12._12_4_ = fStack_4d4;
      local_7d0 = vsubps_avx(auVar19,auVar12);
      local_5b0 = local_710._0_8_;
      uStack_5a8 = local_710._8_8_;
      local_7e0 = (float)local_4c0 * 1.5707964;
      fStack_7dc = local_4c0._4_4_ * 1.5707964;
      fStack_7d8 = (float)uStack_4b8 * 1.5707964;
      fStack_7d4 = uStack_4b8._4_4_ * 1.5707964;
      local_488 = &local_7c0;
      local_490 = local_7d0;
      local_498 = &local_7e0;
      local_470 = CONCAT44(fStack_7bc,local_7c0);
      uStack_468 = CONCAT44(fStack_7b4,fStack_7b8);
      local_480._0_4_ = local_7d0._0_4_;
      local_480._4_4_ = local_7d0._4_4_;
      uStack_478._0_4_ = local_7d0._8_4_;
      uStack_478._4_4_ = local_7d0._12_4_;
      local_450 = local_7c0 * (float)local_480;
      fStack_44c = fStack_7bc * local_480._4_4_;
      fStack_448 = fStack_7b8 * (float)uStack_478;
      fStack_444 = fStack_7b4 * uStack_478._4_4_;
      local_460 = CONCAT44(fStack_7dc,local_7e0);
      uStack_458 = CONCAT44(fStack_7d4,fStack_7d8);
      local_7b0 = local_450 + local_7e0;
      fStack_7ac = fStack_44c + fStack_7dc;
      fStack_7a8 = fStack_448 + fStack_7d8;
      fStack_7a4 = fStack_444 + fStack_7d4;
      local_230 = CONCAT44(fStack_7ac,local_7b0);
      uStack_228 = CONCAT44(fStack_7a4,fStack_7a8);
      local_240 = local_6e0._0_8_;
      uStack_238 = local_6e0._8_8_;
      auVar14._8_8_ = uStack_228;
      auVar14._0_8_ = local_230;
      local_1830 = vpor_avx(auVar14,local_6e0);
      local_16f0 = local_17b0;
      local_1700 = local_1830._0_8_;
      uStack_16f8 = local_1830._8_8_;
      *(undefined1 (*) [16])*local_17b0 = local_1830;
      local_17b0 = (undefined1 (*) [32])(*local_17b0 + 0x10);
      local_5f0 = local_620;
      uStack_5e8 = uStack_618;
      local_5e0 = local_630;
      uStack_5d8 = uStack_628;
      local_5c0 = local_650;
      uStack_5b8 = uStack_648;
      local_5a0 = local_6c0;
      uStack_598 = uStack_6b8;
      local_540 = local_730._0_8_;
      uStack_538 = local_730._8_8_;
      local_520 = local_640;
      uStack_518 = uStack_638;
      local_4c0 = local_710._0_8_;
      uStack_4b8 = local_710._8_8_;
      local_480 = local_7d0._0_8_;
      uStack_478 = local_7d0._8_8_;
      local_260 = local_640;
      uStack_258 = uStack_638;
      local_1f0 = local_700;
      local_1e0 = local_650;
      uStack_1d8 = uStack_648;
      local_1c0 = local_620;
      uStack_1b8 = uStack_618;
      local_1b0 = local_630;
      uStack_1a8 = uStack_628;
      uStack_18c = local_190;
      uStack_188 = local_190;
      uStack_184 = local_190;
      uStack_16c = local_170;
      uStack_168 = local_170;
      uStack_164 = local_170;
      uStack_14c = local_150;
      uStack_148 = local_150;
      uStack_144 = local_150;
      uStack_12c = local_130;
      uStack_128 = local_130;
      uStack_124 = local_130;
      uStack_10c = local_110;
      uStack_108 = local_110;
      uStack_104 = local_110;
      uStack_ec = local_f0;
      uStack_e8 = local_f0;
      uStack_e4 = local_f0;
      uStack_cc = local_d0;
      uStack_c8 = local_d0;
      uStack_c4 = local_d0;
      uStack_ac = local_b0;
      uStack_a8 = local_b0;
      uStack_a4 = local_b0;
      uStack_8c = local_90;
      uStack_88 = local_90;
      uStack_84 = local_90;
      uStack_6c = local_70;
      uStack_68 = local_70;
      uStack_64 = local_70;
      uStack_4c = local_50;
      uStack_48 = local_50;
      uStack_44 = local_50;
    }
    for (; local_17fc < local_17a4; local_17fc = local_17fc + 1) {
      local_1648 = local_1789;
      local_1650 = local_17b0;
      in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
      fVar20 = asinf(*(float *)*local_17b0);
      *(float *)*local_17b0 = fVar20;
      local_17b0 = (undefined1 (*) [32])(*local_17b0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}